

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O2

void asio::detail::executor_function::
     complete<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  allocator<void> allocator;
  ptr p;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> function;
  allocator<void> local_59;
  ptr local_58;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> local_40;
  
  local_58.a = &local_59;
  local_58.v = base;
  local_58.p = (impl<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
                *)base;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>::binder1
            (&local_40,
             (binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *)(base + 1));
  impl<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_58);
  if (call) {
    binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>::operator()(&local_40);
  }
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  impl<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::~ptr(&local_58);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(static_cast<Function&&>(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      static_cast<Function&&>(function)();
    }
  }